

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_inet.c
# Opt level: O0

ngx_int_t ngx_parse_url(ngx_pool_t *pool,ngx_url_t *u)

{
  u_char *s1;
  ulong uVar1;
  ngx_int_t nVar2;
  size_t len;
  u_char *p;
  ngx_url_t *u_local;
  ngx_pool_t *pool_local;
  
  s1 = (u->url).data;
  uVar1 = (u->url).len;
  if ((4 < uVar1) && (nVar2 = ngx_strncasecmp(s1,(u_char *)"unix:",5), nVar2 == 0)) {
    nVar2 = ngx_parse_unix_domain_url(pool,u);
    return nVar2;
  }
  if ((uVar1 == 0) || (*s1 != '[')) {
    pool_local = (ngx_pool_t *)ngx_parse_inet_url(pool,u);
  }
  else {
    pool_local = (ngx_pool_t *)ngx_parse_inet6_url(pool,u);
  }
  return (ngx_int_t)pool_local;
}

Assistant:

ngx_int_t
ngx_parse_url(ngx_pool_t *pool, ngx_url_t *u)
{
    u_char  *p;
    size_t   len;

    p = u->url.data;
    len = u->url.len;

    if (len >= 5 && ngx_strncasecmp(p, (u_char *) "unix:", 5) == 0) {
        return ngx_parse_unix_domain_url(pool, u);
    }

    if (len && p[0] == '[') {
        return ngx_parse_inet6_url(pool, u);
    }

    return ngx_parse_inet_url(pool, u);
}